

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sid.cc
# Opt level: O3

ssize_t __thiscall SID::write(SID *this,int __fd,void *__buf,size_t __n)

{
  ssize_t in_RAX;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ssize_t extraout_RAX_01;
  ssize_t extraout_RAX_02;
  ssize_t extraout_RAX_03;
  ssize_t extraout_RAX_04;
  ssize_t extraout_RAX_05;
  ssize_t extraout_RAX_06;
  ssize_t extraout_RAX_07;
  ssize_t extraout_RAX_08;
  ssize_t extraout_RAX_09;
  reg8 mode_vol;
  EnvelopeGenerator *pEVar1;
  
  mode_vol = (reg8)__buf;
  this->bus_value = mode_vol;
  this->bus_value_ttl = 0x2000;
  switch(__fd) {
  case 0:
    break;
  case 1:
    goto switchD_001690c3_caseD_1;
  case 2:
    goto switchD_001690c3_caseD_2;
  case 3:
    goto switchD_001690c3_caseD_3;
  case 4:
    goto switchD_001690c3_caseD_4;
  case 5:
    pEVar1 = (EnvelopeGenerator *)&this->field_0x58;
    goto LAB_0016919b;
  case 6:
    pEVar1 = (EnvelopeGenerator *)&this->field_0x58;
    goto LAB_00169155;
  case 7:
    this = (SID *)&this->field_0x90;
    break;
  case 8:
    this = (SID *)&this->field_0x90;
    goto switchD_001690c3_caseD_1;
  case 9:
    this = (SID *)&this->field_0x90;
    goto switchD_001690c3_caseD_2;
  case 10:
    this = (SID *)&this->field_0x90;
    goto switchD_001690c3_caseD_3;
  case 0xb:
    this = (SID *)&this->field_0x90;
    goto switchD_001690c3_caseD_4;
  case 0xc:
    pEVar1 = (EnvelopeGenerator *)&this->field_0xe8;
    goto LAB_0016919b;
  case 0xd:
    pEVar1 = (EnvelopeGenerator *)&this->field_0xe8;
    goto LAB_00169155;
  case 0xe:
    this = (SID *)&this->field_0x120;
    break;
  case 0xf:
    this = (SID *)&this->field_0x120;
switchD_001690c3_caseD_1:
    WaveformGenerator::writeFREQ_HI((WaveformGenerator *)this,mode_vol);
    return extraout_RAX_06;
  case 0x10:
    this = (SID *)&this->field_0x120;
switchD_001690c3_caseD_2:
    WaveformGenerator::writePW_LO((WaveformGenerator *)this,mode_vol);
    return extraout_RAX;
  case 0x11:
    this = (SID *)&this->field_0x120;
switchD_001690c3_caseD_3:
    WaveformGenerator::writePW_HI((WaveformGenerator *)this,mode_vol);
    return extraout_RAX_05;
  case 0x12:
    this = (SID *)&this->field_0x120;
switchD_001690c3_caseD_4:
    Voice::writeCONTROL_REG((Voice *)this,mode_vol);
    return extraout_RAX_04;
  case 0x13:
    pEVar1 = (EnvelopeGenerator *)&this->field_0x178;
LAB_0016919b:
    EnvelopeGenerator::writeATTACK_DECAY(pEVar1,mode_vol);
    return extraout_RAX_08;
  case 0x14:
    pEVar1 = (EnvelopeGenerator *)&this->field_0x178;
LAB_00169155:
    EnvelopeGenerator::writeSUSTAIN_RELEASE(pEVar1,mode_vol);
    return extraout_RAX_03;
  case 0x15:
    Filter::writeFC_LO(&this->filter,mode_vol);
    return extraout_RAX_02;
  case 0x16:
    Filter::writeFC_HI(&this->filter,mode_vol);
    return extraout_RAX_07;
  case 0x17:
    Filter::writeRES_FILT(&this->filter,mode_vol);
    return extraout_RAX_09;
  case 0x18:
    Filter::writeMODE_VOL(&this->filter,mode_vol);
    return extraout_RAX_00;
  default:
    return in_RAX;
  }
  WaveformGenerator::writeFREQ_LO((WaveformGenerator *)this,mode_vol);
  return extraout_RAX_01;
}

Assistant:

void SID::write(reg8 offset, reg8 value)
{
  bus_value = value;
  bus_value_ttl = 0x2000;

  switch (offset) {
  case 0x00:
    voice[0].wave.writeFREQ_LO(value);
    break;
  case 0x01:
    voice[0].wave.writeFREQ_HI(value);
    break;
  case 0x02:
    voice[0].wave.writePW_LO(value);
    break;
  case 0x03:
    voice[0].wave.writePW_HI(value);
    break;
  case 0x04:
    voice[0].writeCONTROL_REG(value);
    break;
  case 0x05:
    voice[0].envelope.writeATTACK_DECAY(value);
    break;
  case 0x06:
    voice[0].envelope.writeSUSTAIN_RELEASE(value);
    break;
  case 0x07:
    voice[1].wave.writeFREQ_LO(value);
    break;
  case 0x08:
    voice[1].wave.writeFREQ_HI(value);
    break;
  case 0x09:
    voice[1].wave.writePW_LO(value);
    break;
  case 0x0a:
    voice[1].wave.writePW_HI(value);
    break;
  case 0x0b:
    voice[1].writeCONTROL_REG(value);
    break;
  case 0x0c:
    voice[1].envelope.writeATTACK_DECAY(value);
    break;
  case 0x0d:
    voice[1].envelope.writeSUSTAIN_RELEASE(value);
    break;
  case 0x0e:
    voice[2].wave.writeFREQ_LO(value);
    break;
  case 0x0f:
    voice[2].wave.writeFREQ_HI(value);
    break;
  case 0x10:
    voice[2].wave.writePW_LO(value);
    break;
  case 0x11:
    voice[2].wave.writePW_HI(value);
    break;
  case 0x12:
    voice[2].writeCONTROL_REG(value);
    break;
  case 0x13:
    voice[2].envelope.writeATTACK_DECAY(value);
    break;
  case 0x14:
    voice[2].envelope.writeSUSTAIN_RELEASE(value);
    break;
  case 0x15:
    filter.writeFC_LO(value);
    break;
  case 0x16:
    filter.writeFC_HI(value);
    break;
  case 0x17:
    filter.writeRES_FILT(value);
    break;
  case 0x18:
    filter.writeMODE_VOL(value);
    break;
  default:
    break;
  }
}